

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O2

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,Program *program)

{
  iterator iVar1;
  iterator iVar2;
  
  printStart(this);
  iVar1 = Program::begin_abi_cxx11_(program);
  while( true ) {
    iVar2 = Program::end_abi_cxx11_(program);
    if (iVar1._M_node == iVar2._M_node) break;
    generatePrototypes(this,*(SourceFile **)(iVar1._M_node + 2));
    iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
  }
  iVar1 = Program::begin_abi_cxx11_(program);
  while( true ) {
    iVar2 = Program::end_abi_cxx11_(program);
    if (iVar1._M_node == iVar2._M_node) break;
    (**(code **)**(undefined8 **)(iVar1._M_node + 2))(*(undefined8 **)(iVar1._M_node + 2),this);
    iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
  }
  printEnd(this);
  return;
}

Assistant:

void CppPrinter::visit(Program *program) {
    std::map<std::string, SourceFile*>::iterator it;

    printStart();

    for (it = program->begin(); it != program->end(); ++it) {
        generatePrototypes(it->second);
    }

    for (it = program->begin(); it != program->end(); ++it) {
        it->second->accept(this);
    }

    printEnd();
}